

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_serial.c
# Opt level: O0

int N_VConstVectorArray_Serial(int nvec,realtype c,N_Vector *Z)

{
  int iVar1;
  long lVar2;
  undefined8 *in_RSI;
  int in_EDI;
  realtype in_XMM0_Qa;
  realtype *zd;
  sunindextype N;
  sunindextype j;
  int i;
  int local_20;
  int local_1c;
  int local_4;
  
  if (in_EDI < 1) {
    local_4 = -1;
  }
  else if (in_EDI == 1) {
    N_VConst_Serial(in_XMM0_Qa,(N_Vector)*in_RSI);
    local_4 = 0;
  }
  else {
    iVar1 = **(int **)*in_RSI;
    for (local_1c = 0; local_1c < in_EDI; local_1c = local_1c + 1) {
      lVar2 = *(long *)(*(long *)in_RSI[local_1c] + 8);
      for (local_20 = 0; local_20 < iVar1; local_20 = local_20 + 1) {
        *(realtype *)(lVar2 + (long)local_20 * 8) = in_XMM0_Qa;
      }
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int N_VConstVectorArray_Serial(int nvec, realtype c, N_Vector* Z)
{
  int          i;
  sunindextype j, N;
  realtype*    zd=NULL;

  /* invalid number of vectors */
  if (nvec < 1) return(-1);

  /* should have called N_VConst */
  if (nvec == 1) {
    N_VConst_Serial(c, Z[0]);
    return(0);
  }

  /* get vector length */
  N = NV_LENGTH_S(Z[0]);

  /* set each vector in the vector array to a constant */
  for (i=0; i<nvec; i++) {
    zd = NV_DATA_S(Z[i]);
    for (j=0; j<N; j++) {
      zd[j] = c;
    }
  }

  return(0);
}